

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O1

Aig_Man_t *
Saig_ManCexRefine(Aig_Man_t *p,Aig_Man_t *pAbs,Vec_Int_t *vFlops,int nFrames,int nConfMaxOne,
                 int fUseBdds,int fUseDprove,int fVerbose,int *pnUseStart,int *piRetValue,
                 int *pnFrames)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAVar4;
  Vec_Int_t *__ptr;
  Abc_Cex_t *pAVar5;
  Saig_ParBbr_t *pPars;
  long lVar6;
  Pdr_Par_t Pars;
  
  *piRetValue = -1;
  if ((fUseDprove == 0) || (pAbs->nRegs < 1)) {
    if ((fUseBdds == 0) || (0x4f < pAbs->nRegs - 1U)) {
      iVar2 = 0;
      if (pnUseStart != (int *)0x0) {
        iVar2 = *pnUseStart;
      }
      Saig_BmcPerform(pAbs,iVar2,nFrames,2000,0,nConfMaxOne,0,fVerbose,0,pnFrames,0);
      goto LAB_0056ac6e;
    }
    Bbr_ManSetDefaultParams((Saig_ParBbr_t *)&Pars);
    Pars.nRecycle = 0;
    Pars.nFrameMax = 1000000;
    Pars.nRestLimit = 1;
    Pars.nTimeOut = 1;
    Pars.nTimeOutGap = 1;
    Pars.nTimeOutOne = fVerbose;
    Pars.fTwoRounds = 0;
    Pars.nConfLimit = nFrames;
    iVar2 = Aig_ManVerifyUsingBdds(pAbs,(Saig_ParBbr_t *)&Pars);
  }
  else {
    pAVar4 = Saig_ManDupOrpos(pAbs);
    Pdr_ManSetDefaultParams(&Pars);
    Pars.nTimeOut = 10;
    Pars.fVerbose = fVerbose;
    if (fVerbose != 0) {
      puts("Running property directed reachability...");
    }
    iVar2 = Pdr_ManSolve(pAVar4,&Pars);
    if (pAVar4->pSeqModel != (Abc_Cex_t *)0x0) {
      iVar3 = Saig_ManFindFailedPoCex(pAbs,pAVar4->pSeqModel);
      pAVar4->pSeqModel->iPo = iVar3;
    }
    pAbs->pSeqModel = pAVar4->pSeqModel;
    pAVar4->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pAVar4);
  }
  if (iVar2 != 0) {
    *piRetValue = 1;
  }
LAB_0056ac6e:
  if (pAbs->pSeqModel != (Abc_Cex_t *)0x0) {
    if (pnUseStart != (int *)0x0) {
      *pnUseStart = pAbs->pSeqModel->iFrame;
    }
    iVar2 = Saig_ManCexFirstFlopPi(p,pAbs);
    __ptr = Saig_ManExtendCounterExampleTest3(pAbs,iVar2,pAbs->pSeqModel,fVerbose);
    if (__ptr != (Vec_Int_t *)0x0) {
      uVar1 = __ptr->nSize;
      if (uVar1 != 0) {
        if (fVerbose != 0) {
          printf("Adding %d registers to the abstraction (total = %d).\n\n",(ulong)uVar1,
                 (ulong)(pAbs->nRegs + uVar1));
        }
        if (0 < __ptr->nSize) {
          lVar6 = 0;
          do {
            iVar2 = __ptr->pArray[lVar6];
            if (((long)iVar2 < 0) || (pAbs->vCiNumsOrig->nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar2 = pAbs->vCiNumsOrig->pArray[iVar2];
            if (iVar2 < p->nTruePis) {
              __assert_fail("Entry >= Saig_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldRef.c"
                            ,0xe7,
                            "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                           );
            }
            if (p->nObjs[2] <= iVar2) {
              __assert_fail("Entry < Aig_ManCiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldRef.c"
                            ,0xe8,
                            "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                           );
            }
            Vec_IntPush(vFlops,iVar2 - p->nTruePis);
            lVar6 = lVar6 + 1;
          } while (lVar6 < __ptr->nSize);
        }
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (int *)0x0;
        }
        free(__ptr);
        qsort(vFlops->pArray,(long)vFlops->nSize,4,Vec_IntSortCompare1);
        if (1 < (long)vFlops->nSize) {
          lVar6 = 1;
          do {
            if (vFlops->pArray[lVar6 + -1] == vFlops->pArray[lVar6]) {
              __assert_fail("Vec_IntEntry(vFlops, i-1) != Entry",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldRef.c"
                            ,0xef,
                            "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                           );
            }
            lVar6 = lVar6 + 1;
          } while (vFlops->nSize != lVar6);
        }
        pAVar4 = Saig_ManDupAbstraction(p,vFlops);
        return pAVar4;
      }
      puts("Discovered a true counter-example!");
      pAVar5 = Saig_ManCexRemap(p,pAbs,pAbs->pSeqModel);
      p->pSeqModel = pAVar5;
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      free(__ptr);
      *piRetValue = 0;
    }
  }
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Saig_ManCexRefine( Aig_Man_t * p, Aig_Man_t * pAbs, Vec_Int_t * vFlops, int nFrames, int nConfMaxOne, int fUseBdds, int fUseDprove, int fVerbose, int * pnUseStart, int * piRetValue, int * pnFrames )
{ 
    Vec_Int_t * vFlopsNew;
    int i, Entry, RetValue;
    *piRetValue = -1;
    if ( fUseDprove && Aig_ManRegNum(pAbs) > 0 )
    {
/*
        Fra_Sec_t SecPar, * pSecPar = &SecPar;
        Fra_SecSetDefaultParams( pSecPar );
        pSecPar->fVerbose       = fVerbose;
        RetValue = Fra_FraigSec( pAbs, pSecPar, NULL );
*/
        Aig_Man_t * pAbsOrpos = Saig_ManDupOrpos( pAbs );
        Pdr_Par_t Pars, * pPars = &Pars;
        Pdr_ManSetDefaultParams( pPars );
        pPars->nTimeOut = 10;
        pPars->fVerbose = fVerbose;
        if ( pPars->fVerbose )
            printf( "Running property directed reachability...\n" );
        RetValue = Pdr_ManSolve( pAbsOrpos, pPars );
        if ( pAbsOrpos->pSeqModel )
            pAbsOrpos->pSeqModel->iPo = Saig_ManFindFailedPoCex( pAbs, pAbsOrpos->pSeqModel );
        pAbs->pSeqModel = pAbsOrpos->pSeqModel;
        pAbsOrpos->pSeqModel = NULL;
        Aig_ManStop( pAbsOrpos );
        if ( RetValue )
            *piRetValue = 1;

    }
    else if ( fUseBdds && (Aig_ManRegNum(pAbs) > 0 && Aig_ManRegNum(pAbs) <= 80) )
    {
        Saig_ParBbr_t Pars, * pPars = &Pars;
        Bbr_ManSetDefaultParams( pPars );
        pPars->TimeLimit     = 0;
        pPars->nBddMax       = 1000000;
        pPars->nIterMax      = nFrames;
        pPars->fPartition    = 1;
        pPars->fReorder      = 1;
        pPars->fReorderImage = 1;
        pPars->fVerbose      = fVerbose;
        pPars->fSilent       = 0;
        RetValue = Aig_ManVerifyUsingBdds( pAbs, pPars );
        if ( RetValue )
            *piRetValue = 1;
    }
    else 
    {
        Saig_BmcPerform( pAbs, pnUseStart? *pnUseStart: 0, nFrames, 2000, 0, nConfMaxOne, 0, fVerbose, 0, pnFrames, 0 );
    }
    if ( pAbs->pSeqModel == NULL )
        return NULL;
    if ( pnUseStart )
        *pnUseStart = pAbs->pSeqModel->iFrame;
//    vFlopsNew = Saig_ManExtendCounterExampleTest( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pAbs->pSeqModel, 1, fVerbose );
    vFlopsNew = Saig_ManExtendCounterExampleTest3( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pAbs->pSeqModel, fVerbose );
    if ( vFlopsNew == NULL )
        return NULL;
    if ( Vec_IntSize(vFlopsNew) == 0 )
    {
        printf( "Discovered a true counter-example!\n" );
        p->pSeqModel = Saig_ManCexRemap( p, pAbs, pAbs->pSeqModel );
        Vec_IntFree( vFlopsNew );
        *piRetValue = 0;
        return NULL;
    }
    // vFlopsNew contains PI numbers that should be kept in pAbs
    if ( fVerbose )
        printf( "Adding %d registers to the abstraction (total = %d).\n\n", Vec_IntSize(vFlopsNew), Aig_ManRegNum(pAbs)+Vec_IntSize(vFlopsNew) );
    // add to the abstraction
    Vec_IntForEachEntry( vFlopsNew, Entry, i )
    {
        Entry = Vec_IntEntry(pAbs->vCiNumsOrig, Entry);
        assert( Entry >= Saig_ManPiNum(p) );
        assert( Entry < Aig_ManCiNum(p) );
        Vec_IntPush( vFlops, Entry-Saig_ManPiNum(p) );
    }
    Vec_IntFree( vFlopsNew );

    Vec_IntSort( vFlops, 0 );
    Vec_IntForEachEntryStart( vFlops, Entry, i, 1 )
        assert( Vec_IntEntry(vFlops, i-1) != Entry );

    return Saig_ManDupAbstraction( p, vFlops );
}